

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_dq_string_inner(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int yythunkpos71;
  int yypos71;
  int yythunkpos70;
  int yypos70;
  int yythunkpos67;
  int yypos67;
  int yythunkpos64;
  int yypos64;
  int yythunkpos61;
  int yypos61;
  int yythunkpos59;
  int yypos59;
  int yythunkpos57;
  int yypos57;
  int yythunkpos54;
  int yypos54;
  int yythunkpos39;
  int yypos39;
  int yythunkpos35;
  int yypos35;
  int yythunkpos29;
  int yypos29;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,4,0,"yyPush");
  iVar9 = G->pos;
  iVar3 = G->thunkpos;
  iVar6 = yymatchChar(G,10);
  if (iVar6 != 0) {
    yyDo(G,yy_1_dq_string_inner,G->begin,G->end,"yy_1_dq_string_inner");
    goto LAB_0011596f;
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yymatchChar(G,0x7b);
  if (((iVar6 != 0) && (iVar6 = yy__(G), iVar6 != 0)) && (iVar6 = yy_statementlist(G), iVar6 != 0))
  {
    yyDo(G,yySet,-4,0,"yySet");
    iVar6 = yy__(G);
    if ((iVar6 != 0) && (iVar6 = yymatchChar(G,0x7d), iVar6 != 0)) {
      yyDo(G,yy_2_dq_string_inner,G->begin,G->end,"yy_2_dq_string_inner");
      goto LAB_0011596f;
    }
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yymatchChar(G,0x7b);
  if (((iVar6 != 0) && (iVar6 = yy__(G), iVar6 != 0)) && (iVar6 = yymatchChar(G,0x7d), iVar6 != 0))
  {
    yyDo(G,yy_3_dq_string_inner,G->begin,G->end,"yy_3_dq_string_inner");
    goto LAB_0011596f;
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  yyText(G,G->begin,G->end);
  G->begin = G->pos;
  iVar6 = yymatchClass(G,(uchar *)anon_var_dwarf_2a50,"^>\"{\\\\\\n$%%");
  if (iVar6 != 0) {
    do {
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      iVar9 = yymatchClass(G,(uchar *)anon_var_dwarf_2a50,"^>\"{\\\\\\n$%%");
    } while (iVar9 != 0);
    G->pos = iVar1;
    G->thunkpos = iVar2;
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    yyDo(G,yy_4_dq_string_inner,G->begin,G->end,"yy_4_dq_string_inner");
    goto LAB_0011596f;
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yy_variable(G);
  if (iVar6 != 0) {
    yyDo(G,yySet,-3,0,"yySet");
    iVar6 = yymatchChar(G,0x3c);
    if (((iVar6 != 0) && (iVar6 = yy__(G), iVar6 != 0)) && (iVar6 = yy_atkey_key(G), iVar6 != 0)) {
      yyDo(G,yySet,-2,0,"yySet");
      iVar6 = yy__(G);
      if ((iVar6 != 0) && (iVar6 = yymatchChar(G,0x3e), iVar6 != 0)) {
        yyDo(G,yy_5_dq_string_inner,G->begin,G->end,"yy_5_dq_string_inner");
        goto LAB_0011596f;
      }
    }
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yy_variable(G);
  if (iVar6 != 0) {
    yyDo(G,yySet,-3,0,"yySet");
    iVar6 = yymatchChar(G,0x7b);
    if (((iVar6 != 0) && (iVar6 = yy__(G), iVar6 != 0)) && (iVar6 = yy_expr(G), iVar6 != 0)) {
      yyDo(G,yySet,-2,0,"yySet");
      iVar6 = yy__(G);
      if ((iVar6 != 0) && (iVar6 = yymatchChar(G,0x7d), iVar6 != 0)) {
        yyDo(G,yy_6_dq_string_inner,G->begin,G->end,"yy_6_dq_string_inner");
        goto LAB_0011596f;
      }
    }
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yy_variable(G);
  if (iVar6 != 0) {
    yyDo(G,yySet,-3,0,"yySet");
    iVar6 = G->pos;
    iVar4 = G->thunkpos;
    iVar7 = yymatchChar(G,0x7b);
    if (((iVar7 == 0) || (iVar7 = yy__(G), iVar7 == 0)) || (iVar7 = yymatchChar(G,0x7d), iVar7 == 0)
       ) {
      G->pos = iVar6;
      G->thunkpos = iVar4;
      iVar6 = yymatchChar(G,0x3c);
      if (((iVar6 == 0) || (iVar6 = yy__(G), iVar6 == 0)) ||
         (iVar6 = yymatchChar(G,0x3e), iVar6 == 0)) goto LAB_00114bfb;
    }
    yyDo(G,yy_7_dq_string_inner,G->begin,G->end,"yy_7_dq_string_inner");
    goto LAB_0011596f;
  }
LAB_00114bfb:
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yymatchChar(G,0x25);
  if (iVar6 != 0) {
    yyDo(G,yy_8_dq_string_inner,G->begin,G->end,"yy_8_dq_string_inner");
    goto LAB_0011596f;
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yy_variable(G);
  if (iVar6 != 0) {
    yyDo(G,yySet,-1,0,"yySet");
    yyDo(G,yy_9_dq_string_inner,G->begin,G->end,"yy_9_dq_string_inner");
    goto LAB_0011596f;
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yy_esc(G);
  if ((iVar6 != 0) && (iVar6 = yymatchChar(G,0x61), iVar6 != 0)) {
    yyDo(G,yy_10_dq_string_inner,G->begin,G->end,"yy_10_dq_string_inner");
    goto LAB_0011596f;
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yy_esc(G);
  if ((iVar6 != 0) && (iVar6 = yymatchChar(G,0x62), iVar6 != 0)) {
    yyDo(G,yy_11_dq_string_inner,G->begin,G->end,"yy_11_dq_string_inner");
    goto LAB_0011596f;
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yy_esc(G);
  if ((iVar6 != 0) && (iVar6 = yymatchChar(G,0x74), iVar6 != 0)) {
    yyDo(G,yy_12_dq_string_inner,G->begin,G->end,"yy_12_dq_string_inner");
    goto LAB_0011596f;
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yy_esc(G);
  if ((iVar6 != 0) && (iVar6 = yymatchChar(G,0x72), iVar6 != 0)) {
    yyDo(G,yy_13_dq_string_inner,G->begin,G->end,"yy_13_dq_string_inner");
    goto LAB_0011596f;
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yy_esc(G);
  if ((iVar6 != 0) && (iVar6 = yymatchChar(G,0x6e), iVar6 != 0)) {
    yyDo(G,yy_14_dq_string_inner,G->begin,G->end,"yy_14_dq_string_inner");
    goto LAB_0011596f;
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yy_esc(G);
  if ((iVar6 != 0) && (iVar6 = yymatchChar(G,0x22), iVar6 != 0)) {
    yyDo(G,yy_15_dq_string_inner,G->begin,G->end,"yy_15_dq_string_inner");
    goto LAB_0011596f;
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yy_esc(G);
  if ((iVar6 != 0) && (iVar6 = yymatchChar(G,0x24), iVar6 != 0)) {
    yyDo(G,yy_16_dq_string_inner,G->begin,G->end,"yy_16_dq_string_inner");
    goto LAB_0011596f;
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yy_esc(G);
  if ((iVar6 != 0) && (iVar6 = yymatchChar(G,0x30), iVar6 != 0)) {
    yyDo(G,yy_17_dq_string_inner,G->begin,G->end,"yy_17_dq_string_inner");
    goto LAB_0011596f;
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yy_esc(G);
  if ((iVar6 != 0) && (iVar6 = yymatchChar(G,0x7b), iVar6 != 0)) {
    yyDo(G,yy_18_dq_string_inner,G->begin,G->end,"yy_18_dq_string_inner");
    goto LAB_0011596f;
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yy_esc(G);
  if ((iVar6 != 0) && (iVar6 = yymatchString(G,"c["), iVar6 != 0)) {
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar6 = yymatchClass(G,(uchar *)anon_var_dwarf_2b34,"^\\]");
    if (iVar6 != 0) {
      do {
        iVar6 = G->pos;
        iVar4 = G->thunkpos;
        iVar7 = yymatchClass(G,(uchar *)anon_var_dwarf_2b34,"^\\]");
      } while (iVar7 != 0);
      G->pos = iVar6;
      G->thunkpos = iVar4;
      yyText(G,G->begin,G->end);
      G->end = G->pos;
      iVar6 = yymatchChar(G,0x5d);
      if (iVar6 != 0) {
        yyDo(G,yy_19_dq_string_inner,G->begin,G->end,"yy_19_dq_string_inner");
        goto LAB_0011596f;
      }
    }
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yy_esc(G);
  if ((iVar6 != 0) && (iVar6 = yymatchChar(G,99), iVar6 != 0)) {
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar6 = yymatchClass(G,(uchar *)"","0-9");
    if ((iVar6 != 0) && (iVar6 = yymatchClass(G,(uchar *)"","0-9"), iVar6 != 0)) {
      yyText(G,G->begin,G->end);
      G->end = G->pos;
      yyDo(G,yy_20_dq_string_inner,G->begin,G->end,"yy_20_dq_string_inner");
      goto LAB_0011596f;
    }
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yy_esc(G);
  if ((iVar6 != 0) && (iVar6 = yymatchChar(G,0x78), iVar6 != 0)) {
    iVar6 = G->pos;
    iVar4 = G->thunkpos;
    iVar7 = G->pos;
    iVar5 = G->thunkpos;
    iVar8 = yymatchChar(G,0x30);
    if (iVar8 == 0) {
      G->pos = iVar7;
      G->thunkpos = iVar5;
    }
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar7 = yymatchClass(G,(uchar *)"","a-fA-F0-9");
    if ((iVar7 != 0) && (iVar7 = yymatchClass(G,(uchar *)"","a-fA-F0-9"), iVar7 != 0)) {
      yyText(G,G->begin,G->end);
      G->end = G->pos;
LAB_001154ca:
      yyDo(G,yy_21_dq_string_inner,G->begin,G->end,"yy_21_dq_string_inner");
      goto LAB_0011596f;
    }
    G->pos = iVar6;
    G->thunkpos = iVar4;
    iVar6 = yymatchChar(G,0x5b);
    if (iVar6 != 0) {
      iVar6 = G->pos;
      iVar4 = G->thunkpos;
      iVar7 = yymatchChar(G,0x30);
      if (iVar7 == 0) {
        G->pos = iVar6;
        G->thunkpos = iVar4;
      }
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar6 = yymatchClass(G,(uchar *)"","a-fA-F0-9");
      if ((iVar6 != 0) && (iVar6 = yymatchClass(G,(uchar *)"","a-fA-F0-9"), iVar6 != 0)) {
        yyText(G,G->begin,G->end);
        G->end = G->pos;
        iVar6 = yymatchChar(G,0x5d);
        if (iVar6 != 0) goto LAB_001154ca;
      }
    }
  }
  G->pos = iVar9;
  G->thunkpos = iVar3;
  iVar6 = yy_esc(G);
  if ((iVar6 == 0) || (iVar6 = yymatchChar(G,0x6f), iVar6 == 0)) {
LAB_00115676:
    G->pos = iVar9;
    G->thunkpos = iVar3;
    iVar6 = yy_esc(G);
    if ((iVar6 != 0) && (iVar6 = yymatchString(G,"o["), iVar6 != 0)) {
      iVar6 = G->pos;
      iVar4 = G->thunkpos;
      iVar7 = yymatchChar(G,0x30);
      if (iVar7 == 0) {
        G->pos = iVar6;
        G->thunkpos = iVar4;
      }
      yyText(G,G->begin,G->end);
      G->begin = G->pos;
      iVar6 = yymatchClass(G,(uchar *)"","0-7");
      if ((iVar6 != 0) && (iVar6 = yymatchClass(G,(uchar *)"","0-7"), iVar6 != 0)) {
        yyText(G,G->begin,G->end);
        G->end = G->pos;
        yyDo(G,yy_23_dq_string_inner,G->begin,G->end,"yy_23_dq_string_inner");
        while( true ) {
          iVar6 = G->pos;
          iVar4 = G->thunkpos;
          iVar7 = yymatchChar(G,0x2c);
          if (iVar7 == 0) break;
          iVar7 = G->pos;
          iVar5 = G->thunkpos;
          iVar8 = yymatchChar(G,0x30);
          if (iVar8 == 0) {
            G->pos = iVar7;
            G->thunkpos = iVar5;
          }
          yyText(G,G->begin,G->end);
          G->begin = G->pos;
          iVar7 = yymatchClass(G,(uchar *)"","0-7");
          if ((iVar7 == 0) || (iVar7 = yymatchClass(G,(uchar *)"","0-7"), iVar7 == 0)) break;
          yyText(G,G->begin,G->end);
          G->end = G->pos;
          yyDo(G,yy_24_dq_string_inner,G->begin,G->end,"yy_24_dq_string_inner");
        }
        G->pos = iVar6;
        G->thunkpos = iVar4;
        iVar6 = yymatchChar(G,0x5d);
        if (iVar6 != 0) goto LAB_0011596f;
      }
    }
    G->pos = iVar9;
    G->thunkpos = iVar3;
    iVar9 = yy_esc(G);
    if ((iVar9 == 0) || (iVar9 = yy_esc(G), iVar9 == 0)) {
      G->pos = iVar1;
      G->thunkpos = iVar2;
      return 0;
    }
    yyDo(G,yy_25_dq_string_inner,G->begin,G->end,"yy_25_dq_string_inner");
  }
  else {
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    iVar6 = G->pos;
    iVar4 = G->thunkpos;
    iVar7 = yymatchClass(G,(uchar *)"","0-7");
    if ((iVar7 == 0) || (iVar7 = yymatchClass(G,(uchar *)"","0-7"), iVar7 == 0)) {
      G->pos = iVar6;
      G->thunkpos = iVar4;
      iVar6 = yymatchChar(G,0x30);
      if (((iVar6 == 0) || (iVar6 = yymatchClass(G,(uchar *)"","0-7"), iVar6 == 0)) ||
         (iVar6 = yymatchClass(G,(uchar *)"","0-7"), iVar6 == 0)) goto LAB_00115676;
    }
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    yyDo(G,yy_22_dq_string_inner,G->begin,G->end,"yy_22_dq_string_inner");
  }
LAB_0011596f:
  yyDo(G,yyPop,4,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_dq_string_inner(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 4, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "dq_string_inner"));

  {  int yypos29= G->pos, yythunkpos29= G->thunkpos;  if (!yymatchChar(G, '\n')) goto l30;
  yyDo(G, yy_1_dq_string_inner, G->begin, G->end, "yy_1_dq_string_inner");
  goto l29;
  l30:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yymatchChar(G, '{')) goto l31;
  if (!yy__(G))  goto l31;
  if (!yy_statementlist(G))  goto l31;
  yyDo(G, yySet, -4, 0, "yySet");
  if (!yy__(G))  goto l31;
  if (!yymatchChar(G, '}')) goto l31;
  yyDo(G, yy_2_dq_string_inner, G->begin, G->end, "yy_2_dq_string_inner");
  goto l29;
  l31:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yymatchChar(G, '{')) goto l32;
  if (!yy__(G))  goto l32;
  if (!yymatchChar(G, '}')) goto l32;
  yyDo(G, yy_3_dq_string_inner, G->begin, G->end, "yy_3_dq_string_inner");
  goto l29;
  l32:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l33;  if (!yymatchClass(G, (const unsigned char *)"\377\373\377\377\313\377\377\277\377\377\377\357\377\377\377\367\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377", "^>\"{\\\\\\n$%%")) goto l33;

  l34:;	
  {  int yypos35= G->pos, yythunkpos35= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\377\373\377\377\313\377\377\277\377\377\377\357\377\377\377\367\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377", "^>\"{\\\\\\n$%%")) goto l35;
  goto l34;
  l35:;	  G->pos= yypos35; G->thunkpos= yythunkpos35;
  }  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l33;  yyDo(G, yy_4_dq_string_inner, G->begin, G->end, "yy_4_dq_string_inner");
  goto l29;
  l33:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_variable(G))  goto l36;
  yyDo(G, yySet, -3, 0, "yySet");
  if (!yymatchChar(G, '<')) goto l36;
  if (!yy__(G))  goto l36;
  if (!yy_atkey_key(G))  goto l36;
  yyDo(G, yySet, -2, 0, "yySet");
  if (!yy__(G))  goto l36;
  if (!yymatchChar(G, '>')) goto l36;
  yyDo(G, yy_5_dq_string_inner, G->begin, G->end, "yy_5_dq_string_inner");
  goto l29;
  l36:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_variable(G))  goto l37;
  yyDo(G, yySet, -3, 0, "yySet");
  if (!yymatchChar(G, '{')) goto l37;
  if (!yy__(G))  goto l37;
  if (!yy_expr(G))  goto l37;
  yyDo(G, yySet, -2, 0, "yySet");
  if (!yy__(G))  goto l37;
  if (!yymatchChar(G, '}')) goto l37;
  yyDo(G, yy_6_dq_string_inner, G->begin, G->end, "yy_6_dq_string_inner");
  goto l29;
  l37:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_variable(G))  goto l38;
  yyDo(G, yySet, -3, 0, "yySet");

  {  int yypos39= G->pos, yythunkpos39= G->thunkpos;  if (!yymatchChar(G, '{')) goto l40;
  if (!yy__(G))  goto l40;
  if (!yymatchChar(G, '}')) goto l40;
  goto l39;
  l40:;	  G->pos= yypos39; G->thunkpos= yythunkpos39;  if (!yymatchChar(G, '<')) goto l38;
  if (!yy__(G))  goto l38;
  if (!yymatchChar(G, '>')) goto l38;

  }
  l39:;	  yyDo(G, yy_7_dq_string_inner, G->begin, G->end, "yy_7_dq_string_inner");
  goto l29;
  l38:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yymatchChar(G, '%')) goto l41;
  yyDo(G, yy_8_dq_string_inner, G->begin, G->end, "yy_8_dq_string_inner");
  goto l29;
  l41:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_variable(G))  goto l42;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_9_dq_string_inner, G->begin, G->end, "yy_9_dq_string_inner");
  goto l29;
  l42:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_esc(G))  goto l43;
  if (!yymatchChar(G, 'a')) goto l43;
  yyDo(G, yy_10_dq_string_inner, G->begin, G->end, "yy_10_dq_string_inner");
  goto l29;
  l43:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_esc(G))  goto l44;
  if (!yymatchChar(G, 'b')) goto l44;
  yyDo(G, yy_11_dq_string_inner, G->begin, G->end, "yy_11_dq_string_inner");
  goto l29;
  l44:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_esc(G))  goto l45;
  if (!yymatchChar(G, 't')) goto l45;
  yyDo(G, yy_12_dq_string_inner, G->begin, G->end, "yy_12_dq_string_inner");
  goto l29;
  l45:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_esc(G))  goto l46;
  if (!yymatchChar(G, 'r')) goto l46;
  yyDo(G, yy_13_dq_string_inner, G->begin, G->end, "yy_13_dq_string_inner");
  goto l29;
  l46:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_esc(G))  goto l47;
  if (!yymatchChar(G, 'n')) goto l47;
  yyDo(G, yy_14_dq_string_inner, G->begin, G->end, "yy_14_dq_string_inner");
  goto l29;
  l47:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_esc(G))  goto l48;
  if (!yymatchChar(G, '"')) goto l48;
  yyDo(G, yy_15_dq_string_inner, G->begin, G->end, "yy_15_dq_string_inner");
  goto l29;
  l48:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_esc(G))  goto l49;
  if (!yymatchChar(G, '$')) goto l49;
  yyDo(G, yy_16_dq_string_inner, G->begin, G->end, "yy_16_dq_string_inner");
  goto l29;
  l49:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_esc(G))  goto l50;
  if (!yymatchChar(G, '0')) goto l50;
  yyDo(G, yy_17_dq_string_inner, G->begin, G->end, "yy_17_dq_string_inner");
  goto l29;
  l50:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_esc(G))  goto l51;
  if (!yymatchChar(G, '{')) goto l51;
  yyDo(G, yy_18_dq_string_inner, G->begin, G->end, "yy_18_dq_string_inner");
  goto l29;
  l51:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_esc(G))  goto l52;
  if (!yymatchString(G, "c[")) goto l52;
  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l52;  if (!yymatchClass(G, (const unsigned char *)"\377\377\377\377\377\377\377\377\377\377\377\337\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377", "^\\]")) goto l52;

  l53:;	
  {  int yypos54= G->pos, yythunkpos54= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\377\377\377\377\377\377\377\377\377\377\377\337\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377", "^\\]")) goto l54;
  goto l53;
  l54:;	  G->pos= yypos54; G->thunkpos= yythunkpos54;
  }  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l52;  if (!yymatchChar(G, ']')) goto l52;
  yyDo(G, yy_19_dq_string_inner, G->begin, G->end, "yy_19_dq_string_inner");
  goto l29;
  l52:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_esc(G))  goto l55;
  if (!yymatchChar(G, 'c')) goto l55;
  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l55;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-9")) goto l55;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-9")) goto l55;
  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l55;  yyDo(G, yy_20_dq_string_inner, G->begin, G->end, "yy_20_dq_string_inner");
  goto l29;
  l55:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_esc(G))  goto l56;
  if (!yymatchChar(G, 'x')) goto l56;

  {  int yypos57= G->pos, yythunkpos57= G->thunkpos;
  {  int yypos59= G->pos, yythunkpos59= G->thunkpos;  if (!yymatchChar(G, '0')) goto l59;
  goto l60;
  l59:;	  G->pos= yypos59; G->thunkpos= yythunkpos59;
  }
  l60:;	  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l58;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\176\000\000\000\176\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-fA-F0-9")) goto l58;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\176\000\000\000\176\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-fA-F0-9")) goto l58;
  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l58;  goto l57;
  l58:;	  G->pos= yypos57; G->thunkpos= yythunkpos57;  if (!yymatchChar(G, '[')) goto l56;

  {  int yypos61= G->pos, yythunkpos61= G->thunkpos;  if (!yymatchChar(G, '0')) goto l61;
  goto l62;
  l61:;	  G->pos= yypos61; G->thunkpos= yythunkpos61;
  }
  l62:;	  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l56;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\176\000\000\000\176\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-fA-F0-9")) goto l56;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\176\000\000\000\176\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "a-fA-F0-9")) goto l56;
  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l56;  if (!yymatchChar(G, ']')) goto l56;

  }
  l57:;	  yyDo(G, yy_21_dq_string_inner, G->begin, G->end, "yy_21_dq_string_inner");
  goto l29;
  l56:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_esc(G))  goto l63;
  if (!yymatchChar(G, 'o')) goto l63;
  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l63;
  {  int yypos64= G->pos, yythunkpos64= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-7")) goto l65;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-7")) goto l65;
  goto l64;
  l65:;	  G->pos= yypos64; G->thunkpos= yythunkpos64;  if (!yymatchChar(G, '0')) goto l63;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-7")) goto l63;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-7")) goto l63;

  }
  l64:;	  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l63;  yyDo(G, yy_22_dq_string_inner, G->begin, G->end, "yy_22_dq_string_inner");
  goto l29;
  l63:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_esc(G))  goto l66;
  if (!yymatchString(G, "o[")) goto l66;

  {  int yypos67= G->pos, yythunkpos67= G->thunkpos;  if (!yymatchChar(G, '0')) goto l67;
  goto l68;
  l67:;	  G->pos= yypos67; G->thunkpos= yythunkpos67;
  }
  l68:;	  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l66;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-7")) goto l66;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-7")) goto l66;
  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l66;  yyDo(G, yy_23_dq_string_inner, G->begin, G->end, "yy_23_dq_string_inner");

  l69:;	
  {  int yypos70= G->pos, yythunkpos70= G->thunkpos;  if (!yymatchChar(G, ',')) goto l70;

  {  int yypos71= G->pos, yythunkpos71= G->thunkpos;  if (!yymatchChar(G, '0')) goto l71;
  goto l72;
  l71:;	  G->pos= yypos71; G->thunkpos= yythunkpos71;
  }
  l72:;	  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l70;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-7")) goto l70;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "0-7")) goto l70;
  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l70;  yyDo(G, yy_24_dq_string_inner, G->begin, G->end, "yy_24_dq_string_inner");
  goto l69;
  l70:;	  G->pos= yypos70; G->thunkpos= yythunkpos70;
  }  if (!yymatchChar(G, ']')) goto l66;
  goto l29;
  l66:;	  G->pos= yypos29; G->thunkpos= yythunkpos29;  if (!yy_esc(G))  goto l28;
  if (!yy_esc(G))  goto l28;
  yyDo(G, yy_25_dq_string_inner, G->begin, G->end, "yy_25_dq_string_inner");

  }
  l29:;	  yyprintf((stderr, "  ok   dq_string_inner"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 4, 0, "yyPop");
  return 1;
  l28:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "dq_string_inner"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}